

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QString * QCborValueConstRef::concreteString(QCborValueConstRef self,QString *defaultValue)

{
  qsizetype idx;
  const_reference pEVar1;
  QList<QtCbor::Element> *in_RDI;
  long in_FS_OFFSET;
  Element e;
  QList<QtCbor::Element> *this;
  QCborContainerPrivate *this_00;
  
  this_00 = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pEVar1 = QList<QtCbor::Element>::at(in_RDI,(qsizetype)in_RDI);
  idx._0_4_ = pEVar1->type;
  idx._4_4_ = pEVar1->flags;
  if ((undefined4)idx == 0x60) {
    QCborContainerPrivate::stringAt(this_00,idx);
  }
  else {
    QString::QString((QString *)this,(QString *)in_RDI);
  }
  if (*(QCborContainerPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QCborValueConstRef::concreteString(QCborValueConstRef self, const QString &defaultValue)
{
    QtCbor::Element e = self.d->elements.at(self.i);
    if (e.type != QCborValue::String)
        return defaultValue;
    return self.d->stringAt(self.i);
}